

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapstyle.cpp
# Opt level: O2

void __thiscall
QPixmapStyle::drawSlider
          (QPixmapStyle *this,QStyleOptionComplex *option,QPainter *painter,QWidget *widget)

{
  ControlDescriptor CVar1;
  Orientation OVar2;
  long lVar3;
  QRect QVar4;
  QRect QVar5;
  char cVar6;
  ControlDescriptor CVar7;
  int iVar8;
  QStyleOptionSlider *pQVar9;
  QStyle *pQVar10;
  long lVar11;
  ControlDescriptor CVar12;
  int iVar13;
  long lVar14;
  ControlDescriptor CVar15;
  ControlDescriptor CVar16;
  uint uVar17;
  long in_FS_OFFSET;
  QRect QVar18;
  undefined1 local_b8 [16];
  undefined1 *local_a8;
  QPixmapStyleDescriptor local_98;
  ControlDescriptor local_5c;
  QRect local_58;
  undefined1 local_48 [16];
  Data *local_38;
  
  local_38 = *(Data **)(in_FS_OFFSET + 0x28);
  lVar3 = *(long *)&(this->super_QCommonStyle).super_QStyle.field_0x8;
  pQVar9 = qstyleoption_cast<QStyleOptionSlider_const*>(&option->super_QStyleOption);
  QVar5.x2.m_i = local_58.x2.m_i;
  QVar5.y2.m_i = local_58.y2.m_i;
  QVar5.x1.m_i = local_58.x1.m_i;
  QVar5.y1.m_i = local_58.y1.m_i;
  if (pQVar9 != (QStyleOptionSlider *)0x0) {
    CVar1 = (option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
            super_QFlagsStorage<QStyle::StateFlag>.i;
    CVar12 = CVar1 & LE_Enabled;
    OVar2 = pQVar9->orientation;
    pQVar10 = QStyle::proxy((QStyle *)(ulong)OVar2);
    QVar18 = (QRect)(**(code **)(*(long *)pQVar10 + 0xd8))(pQVar10,3,option,2,widget);
    uVar17 = (option->subControls).super_QFlagsStorageHelper<QStyle::SubControl,_4>.
             super_QFlagsStorage<QStyle::SubControl>.i;
    pQVar10 = (QStyle *)(ulong)uVar17;
    local_48 = (undefined1  [16])QVar18;
    if ((uVar17 & 1) != 0) {
      pQVar10 = QStyle::proxy(pQVar10);
      local_58 = (QRect)(**(code **)(*(long *)pQVar10 + 0xd8))(pQVar10,3,option,1,widget);
      if ((local_58.x1.m_i.m_i <= local_58.x2.m_i.m_i) &&
         (local_58.y1.m_i.m_i <= local_58.y2.m_i.m_i)) {
        CVar7 = (ControlDescriptor)((CVar1 & PB_Enabled) == BG_Background);
        CVar15 = SG_HActiveDisabled;
        if (CVar12 != BG_Background) {
          CVar15 = CVar7 ^ SG_HActivePressed;
        }
        CVar16 = SG_VActiveDisabled;
        if (CVar12 != BG_Background) {
          CVar16 = SG_VActivePressed - CVar7;
        }
        CVar7 = (CVar12 == BG_Background) + SG_VEnabled;
        if (OVar2 == Horizontal) {
          CVar16 = CVar15;
          CVar7 = CVar12 ^ SG_HDisabled;
        }
        drawCachedPixmap(this,CVar7,&local_58,painter);
        local_5c = CVar16;
        QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor>::value
                  (&local_98,
                   (QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor> *)(lVar3 + 0xe8),
                   &local_5c);
        local_a8 = &DAT_aaaaaaaaaaaaaaaa;
        local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QPixmapStylePrivate::getCachedPixmap
                  ((QPixmapStylePrivate *)local_b8,(ControlDescriptor)lVar3,
                   (QPixmapStyleDescriptor *)(ulong)local_5c,(QSize *)&local_98);
        cVar6 = QPixmap::isNull();
        if (cVar6 == '\0') {
          lVar14 = QVar18._0_8_ << 0x20;
          lVar11 = QVar18._8_8_ << 0x20;
          QVar4.x2.m_i = (int)lVar11;
          QVar4.y2.m_i = (int)((ulong)lVar11 >> 0x20);
          QVar4.x1.m_i = (int)lVar14;
          QVar4.y1.m_i = (int)((ulong)lVar14 >> 0x20);
          if (OVar2 != Horizontal) {
            QVar4 = QVar18;
          }
          local_58.x2.m_i = (int)(((QVar4._8_8_ >> 0x20) + (QVar4._0_8_ >> 0x20)) / 2);
          QPainter::drawPixmap(painter,&local_58,(QPixmap *)local_b8,&local_58);
        }
        QPixmap::~QPixmap((QPixmap *)local_b8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
      }
      pQVar10 = (QStyle *)
                (ulong)(option->subControls).super_QFlagsStorageHelper<QStyle::SubControl,_4>.
                       super_QFlagsStorage<QStyle::SubControl>.i;
    }
    QVar5 = local_58;
    if (((((ulong)pQVar10 & 2) != 0) && (QVar18.x1.m_i.m_i <= QVar18.x2.m_i.m_i)) &&
       (QVar18.y1.m_i.m_i <= QVar18.y2.m_i.m_i)) {
      uVar17 = CVar1 >> 1 & 2;
      iVar13 = 0xf;
      if (CVar12 != BG_Background) {
        iVar13 = uVar17 + 0xe;
      }
      iVar8 = 0xc;
      if (CVar12 != BG_Background) {
        iVar8 = uVar17 + 0xb;
      }
      if (OVar2 != Horizontal) {
        iVar8 = iVar13;
      }
      local_b8._0_4_ = iVar8;
      QHash<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>::value
                ((QPixmapStylePixmap *)&local_98,
                 (QHash<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap> *)(lVar3 + 0xf0),
                 (ControlPixmap *)local_b8);
      QPainter::drawPixmap(painter,(QRect *)local_48,(QPixmap *)&local_98);
      QPixmap::~QPixmap((QPixmap *)&local_98);
      QVar5 = local_58;
    }
  }
  if (*(Data **)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  local_58 = QVar5;
  __stack_chk_fail();
}

Assistant:

void QPixmapStyle::drawSlider(const QStyleOptionComplex *option,
                              QPainter *painter, const QWidget *widget) const
{
#if QT_CONFIG(slider)
    Q_D(const QPixmapStyle);

    const QStyleOptionSlider *slider = qstyleoption_cast<const QStyleOptionSlider*>(option);
    if (!slider)
        return;

    const bool enabled = option->state & State_Enabled;
    const bool pressed = option->state & State_Sunken;
    const Qt::Orientation orient = slider->orientation;

    const QRect handle = proxy()->subControlRect(CC_Slider, option, SC_SliderHandle, widget);
    if (option->subControls & SC_SliderGroove) {
        QRect groove = proxy()->subControlRect(CC_Slider, option, SC_SliderGroove, widget);
        if (groove.isValid()) {
            // Draw the background
            ControlDescriptor control;
            if (orient == Qt::Horizontal)
                control = enabled ? SG_HEnabled : SG_HDisabled;
            else
                control = enabled ? SG_VEnabled : SG_VDisabled;
            drawCachedPixmap(control, groove, painter);

            // Draw the active part
            if (orient == Qt::Horizontal) {
                control = enabled ? (pressed ? SG_HActivePressed : SG_HActiveEnabled )
                                  : SG_HActiveDisabled;
            } else {
                control = enabled ? (pressed ? SG_VActivePressed : SG_VActiveEnabled )
                                  : SG_VActiveDisabled;
            }
            const QPixmapStyleDescriptor &desc = d->descriptors.value(control);
            const QPixmap pix = d->getCachedPixmap(control, desc, groove.size());
            if (!pix.isNull()) {
                groove.setRight(orient == Qt::Horizontal
                               ? handle.center().x() : handle.center().y());
                painter->drawPixmap(groove, pix, groove);
            }
        }
    }
    if (option->subControls & SC_SliderHandle) {
        if (handle.isValid()) {
            ControlPixmap pix;
            if (orient == Qt::Horizontal)
                pix = enabled ? (pressed ? SH_HPressed : SH_HEnabled) : SH_HDisabled;
            else
                pix = enabled ? (pressed ? SH_VPressed : SH_VEnabled) : SH_VDisabled;
            painter->drawPixmap(handle, d->pixmaps.value(pix).pixmap);
        }
    }
#else
    Q_UNUSED(option);
    Q_UNUSED(painter);
    Q_UNUSED(widget);
#endif // QT_CONFIG(slider)
}